

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.c
# Opt level: O3

int repeat_segment_mix(mixed_segment *segment)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined8 *puVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  float fVar10;
  uint32_t samples;
  float *out;
  float *in;
  uint32_t local_3c;
  float *local_38;
  float *local_30;
  
  puVar4 = (undefined8 *)segment->data;
  uVar1 = *(uint *)(puVar4 + 3);
  uVar7 = *(uint *)((long)puVar4 + 0x1c);
  lVar5 = puVar4[2];
  local_3c = 0xffffffff;
  if (*(int *)(puVar4 + 5) == 3) {
    local_3c = uVar1 - uVar7;
  }
  mixed_buffer_request_read(&local_30,&local_3c,(mixed_buffer *)*puVar4);
  mixed_buffer_request_write(&local_38,&local_3c,(mixed_buffer *)puVar4[1]);
  if ((ulong)local_3c != 0) {
    uVar2 = *(uint *)(puVar4 + 6);
    iVar3 = *(int *)(puVar4 + 5);
    uVar8 = *(uint *)((long)puVar4 + 0x2c);
    uVar9 = 0;
    do {
      fVar10 = (float)uVar8 / (float)uVar2;
      fVar10 = (1.0 - fVar10) * *(float *)(lVar5 + (ulong)uVar7 * 4) + fVar10 * local_30[uVar9];
      *(float *)(lVar5 + (ulong)uVar7 * 4) = fVar10;
      if (iVar3 == 2) {
        iVar6 = -1;
        if (uVar8 == 0) {
          uVar8 = 0;
        }
        else {
LAB_00143a4f:
          uVar8 = uVar8 + iVar6;
          *(uint *)((long)puVar4 + 0x2c) = uVar8;
        }
      }
      else {
        iVar6 = 1;
        if (uVar8 < uVar2) goto LAB_00143a4f;
      }
      local_38[uVar9] = fVar10;
      uVar7 = (uVar7 + 1) % uVar1;
      uVar9 = uVar9 + 1;
    } while (local_3c != uVar9);
  }
  mixed_buffer_finish_read(local_3c,(mixed_buffer *)*puVar4);
  mixed_buffer_finish_write(local_3c,(mixed_buffer *)puVar4[1]);
  if (((*(int *)(puVar4 + 5) == 3) && (uVar7 == 0)) && (local_3c != 0)) {
    *(undefined4 *)(puVar4 + 5) = 2;
  }
  *(uint *)((long)puVar4 + 0x1c) = uVar7;
  return 1;
}

Assistant:

int repeat_segment_mix(struct mixed_segment *segment){
  struct repeat_segment_data *data = (struct repeat_segment_data *)segment->data;

  uint32_t repeat_samples = data->buffer_size;
  uint32_t index = data->buffer_index;
  float *restrict buf = data->buffer;

  float *restrict in, *restrict out;
  uint32_t samples = UINT32_MAX;
  if (data->mode == MIXED_RECORD_ONCE) {
    samples = repeat_samples - index;
  }

  mixed_buffer_request_read(&in, &samples, data->in);
  mixed_buffer_request_write(&out, &samples, data->out);
  for(uint32_t i=0; i<samples; ++i){
    buf[index] = LERP(buf[index], in[i], data->fade_position/(float)data->fade_length);
    if (data->mode == MIXED_PLAY) {
      if (data->fade_position > 0) {
        data->fade_position--;
      }
    } else {
      if (data->fade_position < data->fade_length) {
        data->fade_position++;
      }
    }
    out[i] = buf[index];
    index = (index+1)%repeat_samples;
  }
  mixed_buffer_finish_read(samples, data->in);
  mixed_buffer_finish_write(samples, data->out);

  if (data->mode == MIXED_RECORD_ONCE && index == 0 && samples > 0) {
    data->mode = MIXED_PLAY;
  }

  data->buffer_index = index;
  return 1;
}